

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::quatf> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::quatf>
          (optional<tinyusdz::value::quatf> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<tinyusdz::value::quatf> local_4c;
  undefined1 local_34 [8];
  quatf value;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  value.imag._M_elems[2] = (float)interp;
  unique0x100000bb = t;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    bVar1 = get_interpolated_value<tinyusdz::value::quatf>
                      (this,(quatf *)local_34,stack0xffffffffffffffe0,
                       (TimeSampleInterpolationType)value.imag._M_elems[2]);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::quatf>::optional<tinyusdz::value::quatf,_0>
                (__return_storage_ptr__,(quatf *)local_34);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::value::quatf>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::quatf>(&local_4c,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::quatf>::optional<tinyusdz::value::quatf,_0>
              (__return_storage_ptr__,&local_4c);
    nonstd::optional_lite::optional<tinyusdz::value::quatf>::~optional(&local_4c);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }